

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

FADFADSTATE * FADcos(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  uint sz;
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  FADFADSTATE *extraout_RAX;
  long lVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  Fad<double> cosaval;
  Fad<double> sinaval;
  FadExpr<FadFuncSin<Fad<double>_>_> local_d0;
  Fad<double> local_a8;
  Fad<double> local_88;
  undefined1 local_68 [32];
  double local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  FadExpr<FadUnaryMin<Fad<double>_>_> local_38;
  
  FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_68,&x->val_);
  FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr(&local_d0,(FadFuncSin<Fad<double>_> *)local_68);
  Fad<double>::~Fad((Fad<double> *)local_68);
  local_88.val_ = sin(local_d0.fadexpr_.expr_.val_);
  local_88.dx_.num_elts = 0;
  local_88.dx_.ptr_to_data = (double *)0x0;
  if ((long)local_d0.fadexpr_.expr_.dx_.num_elts < 1) {
    local_88.defaultVal = 0.0;
  }
  else {
    local_88.dx_.num_elts = local_d0.fadexpr_.expr_.dx_.num_elts;
    uVar5 = (long)local_d0.fadexpr_.expr_.dx_.num_elts * 8;
    pdVar2 = (double *)operator_new__(uVar5);
    local_88.dx_.ptr_to_data = pdVar2;
    local_88.defaultVal = 0.0;
    uVar6 = 0;
    do {
      pdVar3 = (double *)((long)local_d0.fadexpr_.expr_.dx_.ptr_to_data + uVar6);
      if (local_d0.fadexpr_.expr_.dx_.num_elts == 0) {
        pdVar3 = &local_d0.fadexpr_.expr_.defaultVal;
      }
      local_48 = *pdVar3;
      dVar1 = cos(local_d0.fadexpr_.expr_.val_);
      *(double *)((long)pdVar2 + uVar6) = dVar1 * local_48;
      uVar6 = uVar6 + 8;
    } while (uVar5 != uVar6);
  }
  Fad<double>::~Fad(&local_d0.fadexpr_.expr_);
  FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_68,&x->val_);
  FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)&local_d0,(FadFuncCos<Fad<double>_> *)local_68);
  Fad<double>::~Fad((Fad<double> *)local_68);
  local_a8.val_ = cos(local_d0.fadexpr_.expr_.val_);
  local_a8.dx_.num_elts = 0;
  local_a8.dx_.ptr_to_data = (double *)0x0;
  if ((long)local_d0.fadexpr_.expr_.dx_.num_elts < 1) {
    local_a8.defaultVal = 0.0;
  }
  else {
    local_a8.dx_.num_elts = local_d0.fadexpr_.expr_.dx_.num_elts;
    uVar5 = (long)local_d0.fadexpr_.expr_.dx_.num_elts * 8;
    pdVar2 = (double *)operator_new__(uVar5);
    local_a8.dx_.ptr_to_data = pdVar2;
    local_a8.defaultVal = 0.0;
    uVar6 = 0;
    do {
      pdVar3 = (double *)((long)local_d0.fadexpr_.expr_.dx_.ptr_to_data + uVar6);
      if (local_d0.fadexpr_.expr_.dx_.num_elts == 0) {
        pdVar3 = &local_d0.fadexpr_.expr_.defaultVal;
      }
      local_48 = -*pdVar3;
      uStack_40 = 0;
      uStack_3c = 0x80000000;
      dVar1 = sin(local_d0.fadexpr_.expr_.val_);
      *(double *)((long)pdVar2 + uVar6) = dVar1 * local_48;
      uVar6 = uVar6 + 8;
    } while (uVar5 != uVar6);
  }
  Fad<double>::~Fad(&local_d0.fadexpr_.expr_);
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_a8);
  if (0 < (int)sz) {
    lVar4 = 0;
    i = 0;
    do {
      local_38.fadexpr_.expr_ = (FadUnaryMin<Fad<double>_>)&local_88;
      Fad<Fad<double>_>::dx((Fad<double> *)&local_d0,x,i);
      local_68._0_8_ = &local_38;
      local_68._8_8_ = (Fad<double> *)&local_d0;
      Fad<double>::operator=
                ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + lVar4),
                 (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
                 local_68);
      Fad<double>::~Fad((Fad<double> *)&local_d0);
      i = i + 1;
      lVar4 = lVar4 + 0x20;
    } while ((ulong)sz << 5 != lVar4);
  }
  Fad<double>::~Fad(&local_a8);
  Fad<double>::~Fad(&local_88);
  return extraout_RAX;
}

Assistant:

static FADFADSTATE FADcos(FADFADSTATE x)
{
    Fad<STATE> sinaval = sin(x.val());
    Fad<STATE> cosaval = cos(x.val());
    int sz = x.size();
    FADFADSTATE cosa(sz,cosaval);
    for (int i=0; i<sz; i++) {
        cosa.fastAccessDx(i) = -sinaval*x.dx(i);
    }
    return cosa;
}